

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O1

void __thiscall
RVO::RVOSimulator::setAgentDefaults
          (RVOSimulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,float radius,
          float maxSpeed,Vector3 *velocity)

{
  Agent *pAVar1;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    pAVar1 = (Agent *)operator_new(0x88);
    Agent::Agent(pAVar1,this);
    this->defaultAgent_ = pAVar1;
  }
  pAVar1 = this->defaultAgent_;
  pAVar1->maxNeighbors_ = maxNeighbors;
  pAVar1->maxSpeed_ = maxSpeed;
  pAVar1->neighborDist_ = neighborDist;
  pAVar1->radius_ = radius;
  pAVar1->timeHorizon_ = timeHorizon;
  Vector3::operator=(&pAVar1->velocity_,velocity);
  return;
}

Assistant:

void RVOSimulator::setAgentDefaults(float neighborDist,
                                    std::size_t maxNeighbors, float timeHorizon,
                                    float radius, float maxSpeed,
                                    const Vector3 &velocity) {
  if (defaultAgent_ == NULL) {
    defaultAgent_ = new Agent(this);
  }

  defaultAgent_->maxNeighbors_ = maxNeighbors;
  defaultAgent_->maxSpeed_ = maxSpeed;
  defaultAgent_->neighborDist_ = neighborDist;
  defaultAgent_->radius_ = radius;
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->velocity_ = velocity;
}